

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from,CopyFn copy_fn)

{
  int n;
  int iVar1;
  RepeatedPtrFieldBase **v1;
  RepeatedPtrFieldBase **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  void **ppvVar3;
  Arena *pAVar4;
  void *pvVar5;
  Rep *pRVar6;
  void **next;
  void **prefetch_end;
  Arena *arena;
  int recycled;
  ptrdiff_t kPrefetchstride;
  void **end;
  void **src;
  void **dst;
  int new_size;
  LogMessage local_90;
  Voidify local_79;
  RepeatedPtrFieldBase *local_78;
  RepeatedPtrFieldBase *local_70;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CopyFn copy_fn_local;
  RepeatedPtrFieldBase *from_local;
  RepeatedPtrFieldBase *this_local;
  void *local_40;
  ulong local_38;
  size_t line;
  long local_28;
  void *prefetch_ptr;
  ptrdiff_t offset;
  RepeatedPtrFieldBase *local_10;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
    offset = local_38;
    prefetch_ptr = (void *)(local_38 * 0x40 + 0x40);
    local_28 = (long)from + (long)prefetch_ptr;
    local_10 = from;
  }
  local_70 = from;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)copy_fn;
  copy_fn_local = (CopyFn)from;
  from_local = this;
  this_local = from;
  line = (size_t)from;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedPtrFieldBase_const*>(&local_70);
  local_78 = this;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedPtrFieldBase*>(&local_78);
  local_68 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::internal::RepeatedPtrFieldBase_const*,google::protobuf::internal::RepeatedPtrFieldBase*>
                       (v1,v2,"&from != this");
  if (local_68 == (Nullable<const_char_*>)0x0) {
    n = this->current_size_ + *(int *)(copy_fn_local + 8);
    src = InternalReserve(this,n);
    end = elements((RepeatedPtrFieldBase *)copy_fn_local);
    ppvVar3 = end + *(int *)(copy_fn_local + 8);
    iVar1 = ClearedCount(this);
    if (0 < iVar1) {
      iVar1 = MergeIntoClearedMessages(this,(RepeatedPtrFieldBase *)copy_fn_local);
      src = src + iVar1;
      end = end + iVar1;
    }
    pAVar4 = GetArena(this);
    if (0 < *(int *)(copy_fn_local + 8)) {
      for (; end < ppvVar3 + -1; end = end + 1) {
        local_40 = end[1];
        pvVar5 = (void *)(*(code *)absl_log_internal_check_op_result)(pAVar4,*end);
        *src = pvVar5;
        src = src + 1;
      }
    }
    for (; end < ppvVar3; end = end + 1) {
      pvVar5 = (void *)(*(code *)absl_log_internal_check_op_result)(pAVar4,*end);
      *src = pvVar5;
      src = src + 1;
    }
    ExchangeCurrentSize(this,n);
    iVar1 = allocated_size(this);
    if (iVar1 < n) {
      pRVar6 = rep(this);
      pRVar6->allocated_size = n;
    }
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_68);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
             ,0xbf,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void RepeatedPtrFieldBase::MergeFromConcreteMessage(
    const RepeatedPtrFieldBase& from, CopyFn copy_fn) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  void** dst = InternalReserve(new_size);
  const void* const* src = from.elements();
  auto end = src + from.current_size_;
  constexpr ptrdiff_t kPrefetchstride = 1;
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  if (from.current_size_ >= kPrefetchstride) {
    auto prefetch_end = end - kPrefetchstride;
    for (; src < prefetch_end; ++src, ++dst) {
      auto next = src + kPrefetchstride;
      absl::PrefetchToLocalCache(*next);
      *dst = copy_fn(arena, *src);
    }
  }
  for (; src < end; ++src, ++dst) {
    *dst = copy_fn(arena, *src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}